

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayout::addItem(QFormLayout *this,QLayoutItem *item)

{
  QFormLayoutPrivate *this_00;
  int row;
  
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  row = QFormLayoutPrivate::insertRow
                  (this_00,(int)((ulong)(this_00->m_matrix).m_storage.d.size >> 1));
  QFormLayoutPrivate::setItem(this_00,row,FieldRole,item);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QFormLayout::addItem(QLayoutItem *item)
{
    Q_D(QFormLayout);

    int row = d->insertRow(d->m_matrix.rowCount());
    d->setItem(row, FieldRole, item);
    invalidate();
}